

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O1

string * __thiscall
ListPanel::writeXml_abi_cxx11_(string *__return_storage_ptr__,ListPanel *this,int indent)

{
  int indent_00;
  pointer pcVar1;
  char cVar2;
  ostream *poVar3;
  stringstream str;
  char *local_298;
  long local_290;
  char local_288 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Util::getIndent_abi_cxx11_(0);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_298,local_290);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"<ListPanel",10);
  if (local_298 != local_288) {
    operator_delete(local_298);
  }
  Widget::writeXmlAttributes(&this->super_Widget,(stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,">",1);
  cVar2 = (char)(ostream *)local_1a8;
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"ScrollBarVisibility","");
  indent_00 = indent + 1;
  Util::writeXmlElement<ScrollBarVisibility>
            ((stringstream *)local_1b8,indent_00,&local_1d8,this->scrollBarVisibility);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"ShowItemBorder","");
  Util::writeXmlElement<ScrollBarVisibility>
            ((stringstream *)local_1b8,indent_00,&local_1f8,this->scrollBarVisibility);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"ShowSection","");
  Util::writeXmlElement<ScrollBarVisibility>
            ((stringstream *)local_1b8,indent_00,&local_218,this->scrollBarVisibility);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p);
  }
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"ShowEmptySection","");
  Util::writeXmlElement<ScrollBarVisibility>
            ((stringstream *)local_1b8,indent_00,&local_238,this->scrollBarVisibility);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"ListPanelItemName","");
  pcVar1 = (this->listPanelItemName)._M_dataplus._M_p;
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_278,pcVar1,pcVar1 + (this->listPanelItemName)._M_string_length);
  Util::writeXmlElement<std::__cxx11::string>
            ((stringstream *)local_1b8,indent_00,&local_258,&local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  Widget::writeXmlChildren(&this->super_Widget,(stringstream *)local_1b8,indent_00);
  Util::getIndent_abi_cxx11_(0);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_298,local_290);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"</ListPanel>",0xc);
  if (local_298 != local_288) {
    operator_delete(local_298);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string ListPanel::writeXml(int indent)
{
	std::stringstream str;
	str << Util::getIndent(indent) << "<ListPanel";
	writeXmlAttributes(str);
	str << ">" << std::endl;

	Util::writeXmlElement(str, indent + 1, "ScrollBarVisibility", scrollBarVisibility);
	Util::writeXmlElement(str, indent + 1, "ShowItemBorder", scrollBarVisibility);
	Util::writeXmlElement(str, indent + 1, "ShowSection", scrollBarVisibility);
	Util::writeXmlElement(str, indent + 1, "ShowEmptySection", scrollBarVisibility);
	Util::writeXmlElement(str, indent + 1, "ListPanelItemName", listPanelItemName);

	writeXmlChildren(str, indent + 1);
	
	str << Util::getIndent(indent) << "</ListPanel>";
	return str.str();
}